

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall
ncnn::Interp::eval_size_expr
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *outw,
          int *outh)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> sizes;
  vector<int,_std::allocator<int>_> local_38;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar1 = eval_list_expression(&this->size_expr,bottom_blobs,&local_38);
  iVar3 = -1;
  if (iVar1 == 0) {
    if ((local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) &&
       ((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < 9)) {
      *outw = *local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = &((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start)->h;
      if ((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 4) {
        piVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
      }
      *outh = *piVar2;
      iVar3 = 0;
    }
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int Interp::eval_size_expr(const std::vector<Mat>& bottom_blobs, int& outw, int& outh) const
{
    // [size(@0,0),size(@0,1)]
    std::vector<int> sizes;
    int er = eval_list_expression(size_expr, bottom_blobs, sizes);
    if (er != 0)
        return -1;

    if (sizes.empty() || sizes.size() > 2)
        return -1;

    if (sizes.size() == 1)
    {
        outw = sizes[0];
        outh = bottom_blobs[0].h;
    }
    else
    {
        outw = sizes[0];
        outh = sizes[1];
    }

    return 0;
}